

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  cmMakefile *this_00;
  int iVar1;
  cmValue cVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  undefined4 extraout_var;
  string_view source;
  string output;
  RuleVariables vars;
  string local_1b0;
  string local_190;
  RuleVariables local_170;
  cmRulePlaceholderExpander *this_01;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"RULE_LAUNCH_CUSTOM",(allocator<char> *)&local_1b0);
  cVar2 = cmMakefile::GetProperty(this_00,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  if ((cVar2.Value == (string *)0x0) || ((cVar2.Value)->_M_string_length == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    memset(&local_170,0,0x150);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    local_1b0._M_string_length = 0;
    local_1b0.field_2._M_local_buf[0] = '\0';
    pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_assign((string *)&local_1b0);
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_190,ccg);
      std::__cxx11::string::~string((string *)&local_190);
      if (local_190._M_string_length == 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_190,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_1b0);
        std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_190);
        std::__cxx11::string::~string((string *)&local_190);
      }
      source._M_str = local_1b0._M_dataplus._M_p;
      source._M_len = local_1b0._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_190,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
    }
    local_170.Output = local_1b0._M_dataplus._M_p;
    iVar1 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                      (this);
    this_01 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar1);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar2.Value);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (this_01,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,__return_storage_ptr__,&local_170);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    (*(this_01->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_01);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  cmValue property_value = this->Makefile->GetProperty("RULE_LAUNCH_CUSTOM");

  if (!cmNonempty(property_value)) {
    return std::string();
  }

  // Expand rule variables referenced in the given launcher command.
  cmRulePlaceholderExpander::RuleVariables vars;

  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if (!outputs.empty()) {
    output = outputs[0];
    if (ccg.GetWorkingDirectory().empty()) {
      output = this->MaybeRelativeToCurBinDir(output);
    }
    output = this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
  }
  vars.Output = output.c_str();

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  std::string launcher = *property_value;
  rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
  if (!launcher.empty()) {
    launcher += " ";
  }

  return launcher;
}